

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,float,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  value_type vVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  const_reference pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  idx_t local_68;
  float local_40;
  float local_3c;
  data_ptr_t local_38;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar6 = rhs_row_locations->data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      local_68 = 0;
      uVar10 = 0;
      do {
        uVar9 = uVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar10];
        }
        psVar4 = pSVar2->sel_vector;
        uVar8 = uVar9;
        if (psVar4 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar4[uVar9];
        }
        local_40 = *(float *)(*(long *)(pdVar6 + uVar9 * 8) + vVar3);
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar6 + uVar9 * 8) + (col_idx >> 3))) != 0) &&
           (bVar11 = Equals::Operation<float>((float *)(pdVar1 + uVar8 * 4),&local_40), !bVar11)) {
          sel->sel_vector[local_68] = (sel_t)uVar9;
          local_68 = local_68 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
      return local_68;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    local_38 = (lhs_format->unified).data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      local_68 = 0;
      uVar10 = 0;
      do {
        uVar9 = uVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar10];
        }
        psVar4 = pSVar2->sel_vector;
        uVar8 = uVar9;
        if (psVar4 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar4[uVar9];
        }
        puVar5 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar11 = false;
        }
        else {
          bVar11 = (puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0;
        }
        local_3c = *(float *)(*(long *)(pdVar1 + uVar9 * 8) + vVar3);
        if (((!bVar11) &&
            (((uint)*(byte *)(*(long *)(pdVar1 + uVar9 * 8) + (col_idx >> 3)) &
             1 << ((byte)col_idx & 7)) != 0)) &&
           (bVar11 = Equals::Operation<float>((float *)(local_38 + uVar8 * 4),&local_3c), !bVar11))
        {
          sel->sel_vector[local_68] = (sel_t)uVar9;
          local_68 = local_68 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
      return local_68;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}